

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProduct::~IfcProduct(IfcProduct *this)

{
  LazyObject *pLVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].super_IfcObject.field_0x48 = 0x80f958;
  *(undefined8 *)&(this->super_IfcObject).field_0x30 = 0x80f9d0;
  *(undefined8 *)&this[-1].super_IfcObject.field_0xd0 = 0x80f980;
  *(undefined8 *)&this[-1].super_IfcObject.field_0xe0 = 0x80f9a8;
  pLVar1 = this[-1].Representation.ptr.obj;
  if (pLVar1 != (LazyObject *)&this[-1].field_0x100) {
    operator_delete(pLVar1,*(long *)&this[-1].field_0x100 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcObject.field_0x48 = 0x80fa70;
  *(undefined8 *)&(this->super_IfcObject).field_0x30 = 0x80fa98;
  puVar3 = *(undefined1 **)
            &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  puVar2 = &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
            field_0x20;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar3 = *(undefined1 **)&this[-1].super_IfcObject.field_0x80;
  puVar2 = &this[-1].super_IfcObject.field_0x90;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcObject.field_0x58;
  puVar3 = &this[-1].super_IfcObject.field_0x68;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcObject.field_0x48,0x118);
  return;
}

Assistant:

IfcProduct() : Object("IfcProduct") {}